

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int wally_psbt_output_set_blinding_pubkey
              (wally_psbt_output *output,uchar *pub_key,size_t pub_key_len)

{
  int ret;
  size_t pub_key_len_local;
  uchar *pub_key_local;
  wally_psbt_output *output_local;
  
  if ((output == (wally_psbt_output *)0x0) || ((pub_key != (uchar *)0x0) != (pub_key_len != 0))) {
    output_local._4_4_ = -2;
  }
  else if ((pub_key == (uchar *)0x0) ||
          (output_local._4_4_ = wally_ec_public_key_verify(pub_key,pub_key_len),
          output_local._4_4_ == 0)) {
    output_local._4_4_ =
         replace_bytes(pub_key,pub_key_len,&output->blinding_pubkey,&output->blinding_pubkey_len);
  }
  return output_local._4_4_;
}

Assistant:

int wally_psbt_output_set_blinding_pubkey(struct wally_psbt_output *output,
                                          const unsigned char *pub_key,
                                          size_t pub_key_len)
{
    int ret;
    if (!output || BYTES_INVALID(pub_key, pub_key_len))
        return WALLY_EINVAL;
    if (pub_key &&
        (ret = wally_ec_public_key_verify(pub_key, pub_key_len)) != WALLY_OK)
        return ret;
    return replace_bytes(pub_key, pub_key_len,
                         &output->blinding_pubkey, &output->blinding_pubkey_len);
}